

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_sonarqube.hpp
# Opt level: O2

void __thiscall
Catch::SonarQubeReporter::testRunStarting(SonarQubeReporter *this,TestRunInfo *testRunInfo)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"testExecutions",&local_29);
  XmlWriter::startElement(&this->xml,&local_28,Newline|Indent);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"version",&local_29);
  XmlWriter::writeAttribute<char[2]>(&this->xml,&local_28,(char (*) [2])0x265ad6);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void testRunStarting(TestRunInfo const& testRunInfo) override {
            CumulativeReporterBase::testRunStarting(testRunInfo);
            xml.startElement("testExecutions");
            xml.writeAttribute("version", "1");
        }